

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O3

void Wlc_BlastPower(Gia_Man_t *pNew,int *pNum,int nNum,int *pExp,int nExp,Vec_Int_t *vTemp,
                   Vec_Int_t *vRes)

{
  int *pArg0;
  int iVar1;
  Vec_Int_t *p;
  Vec_Int_t *vRes_00;
  int *__ptr;
  int *__s;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int *local_80;
  
  uVar2 = (ulong)(uint)nNum;
  p = (Vec_Int_t *)malloc(0x10);
  iVar1 = 0x10;
  if (0xe < nNum * 2 - 1U) {
    iVar1 = nNum * 2;
  }
  p->nSize = 0;
  p->nCap = iVar1;
  if (iVar1 == 0) {
    local_80 = (int *)0x0;
  }
  else {
    local_80 = (int *)malloc((long)iVar1 * 4);
  }
  p->pArray = local_80;
  vRes_00 = (Vec_Int_t *)malloc(0x10);
  vRes_00->nSize = 0;
  vRes_00->nCap = iVar1;
  if (iVar1 == 0) {
    __ptr = (int *)0x0;
  }
  else {
    __ptr = (int *)malloc((long)iVar1 << 2);
  }
  vRes_00->pArray = __ptr;
  pArg0 = vRes->pArray;
  __s = pArg0;
  if (vRes->nCap < nNum) {
    if (pArg0 == (int *)0x0) {
      __s = (int *)malloc((long)nNum << 2);
    }
    else {
      __s = (int *)realloc(pArg0,(long)nNum << 2);
    }
    vRes->pArray = __s;
    if (__s == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vRes->nCap = nNum;
  }
  if (nNum < 1) {
    vRes->nSize = nNum;
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  memset(__s,0,uVar2 * 4);
  vRes->nSize = nNum;
  *__s = 1;
  if (0 < nExp) {
    uVar4 = 0;
    local_80 = (int *)0x0;
    do {
      if (uVar4 == 0) {
        p->nSize = 0;
        uVar3 = 0;
        do {
          Vec_IntPush(p,pNum[uVar3]);
          uVar3 = uVar3 + 1;
        } while (uVar2 != uVar3);
      }
      else {
        Wlc_BlastMultiplier2(pNew,local_80,local_80,nNum,vTemp,vRes_00);
        p->nSize = 0;
        uVar3 = 0;
        do {
          Vec_IntPush(p,__ptr[uVar3]);
          uVar3 = uVar3 + 1;
        } while (uVar2 != uVar3);
      }
      local_80 = p->pArray;
      Wlc_BlastMultiplier2(pNew,pArg0,local_80,nNum,vTemp,vRes_00);
      uVar3 = 0;
      do {
        iVar1 = Gia_ManHashMux(pNew,pExp[uVar4],__ptr[uVar3],pArg0[uVar3]);
        pArg0[uVar3] = iVar1;
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)nExp);
    __ptr = vRes_00->pArray;
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
    local_80 = p->pArray;
  }
  free(vRes_00);
  if (local_80 != (int *)0x0) {
    free(local_80);
  }
  free(p);
  return;
}

Assistant:

void Wlc_BlastPower( Gia_Man_t * pNew, int * pNum, int nNum, int * pExp, int nExp, Vec_Int_t * vTemp, Vec_Int_t * vRes )
{
    Vec_Int_t * vDegrees = Vec_IntAlloc( 2*nNum );
    Vec_Int_t * vResTemp = Vec_IntAlloc( 2*nNum );
    int i, * pDegrees = NULL, * pRes = Vec_IntArray(vRes);
    int k, * pResTemp = Vec_IntArray(vResTemp);
    Vec_IntFill( vRes, nNum, 0 );
    Vec_IntWriteEntry( vRes, 0, 1 );
    for ( i = 0; i < nExp; i++ )
    {
        if ( i == 0 )
            pDegrees = Wlc_VecCopy( vDegrees, pNum, nNum );
        else
        {
            Wlc_BlastMultiplier2( pNew, pDegrees, pDegrees, nNum, vTemp, vResTemp );
            pDegrees = Wlc_VecCopy( vDegrees, pResTemp, nNum );
        }
        Wlc_BlastMultiplier2( pNew, pRes, pDegrees, nNum, vTemp, vResTemp );
        for ( k = 0; k < nNum; k++ )
            pRes[k] = Gia_ManHashMux( pNew, pExp[i], pResTemp[k], pRes[k] );
    }
    Vec_IntFree( vResTemp );
    Vec_IntFree( vDegrees );
}